

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O1

jint Java_beagle_BeagleJNIWrapper_calculateRootLogLikelihoodsByPartition
               (JNIEnv *env,jobject obj,jint instance,jintArray inBufferIndices,
               jintArray inCategoryWeightsIndices,jintArray inStateFrequenciesIndices,
               jintArray inScalingIndices,jintArray inPartitionIndices,jint partitionCount,
               jint count,jdoubleArray outSumLogLikelihoodByPartition,
               jdoubleArray outSumLogLikelihoods)

{
  jint jVar1;
  jint *pjVar2;
  jint *pjVar3;
  jint *pjVar4;
  jint *pjVar5;
  jint *pjVar6;
  jdouble *pjVar7;
  jdouble *pjVar8;
  
  pjVar2 = (*env->functions->GetIntArrayElements)(env,inBufferIndices,(jboolean *)0x0);
  pjVar3 = (*env->functions->GetIntArrayElements)(env,inCategoryWeightsIndices,(jboolean *)0x0);
  pjVar4 = (*env->functions->GetIntArrayElements)(env,inStateFrequenciesIndices,(jboolean *)0x0);
  pjVar5 = (*env->functions->GetIntArrayElements)(env,inScalingIndices,(jboolean *)0x0);
  pjVar6 = (*env->functions->GetIntArrayElements)(env,inPartitionIndices,(jboolean *)0x0);
  pjVar7 = (*env->functions->GetDoubleArrayElements)
                     (env,outSumLogLikelihoodByPartition,(jboolean *)0x0);
  pjVar8 = (*env->functions->GetDoubleArrayElements)(env,outSumLogLikelihoods,(jboolean *)0x0);
  jVar1 = beagleCalculateRootLogLikelihoodsByPartition
                    (instance,pjVar2,pjVar3,pjVar4,pjVar5,pjVar6,partitionCount,count,pjVar7,pjVar8)
  ;
  (*env->functions->ReleaseDoubleArrayElements)(env,outSumLogLikelihoodByPartition,pjVar7,0);
  (*env->functions->ReleaseDoubleArrayElements)(env,outSumLogLikelihoods,pjVar8,0);
  (*env->functions->ReleaseIntArrayElements)(env,inPartitionIndices,pjVar6,2);
  (*env->functions->ReleaseIntArrayElements)(env,inScalingIndices,pjVar5,2);
  (*env->functions->ReleaseIntArrayElements)(env,inStateFrequenciesIndices,pjVar4,2);
  (*env->functions->ReleaseIntArrayElements)(env,inCategoryWeightsIndices,pjVar3,2);
  (*env->functions->ReleaseIntArrayElements)(env,inBufferIndices,pjVar2,2);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_calculateRootLogLikelihoodsByPartition
  (JNIEnv *env, jobject obj, jint instance, jintArray inBufferIndices, jintArray inCategoryWeightsIndices, jintArray inStateFrequenciesIndices, jintArray inScalingIndices, jintArray inPartitionIndices, jint partitionCount, jint count, jdoubleArray outSumLogLikelihoodByPartition, jdoubleArray outSumLogLikelihoods)
{
    jint *bufferIndices = env->GetIntArrayElements(inBufferIndices, NULL);
    jint *weightsIndices = env->GetIntArrayElements(inCategoryWeightsIndices, NULL);
    jint *frequenciesIndices = env->GetIntArrayElements(inStateFrequenciesIndices, NULL);
    jint *scalingIndices = env->GetIntArrayElements(inScalingIndices, NULL);
    jint *partitionIndices = env->GetIntArrayElements(inPartitionIndices, NULL);

    jdouble *sumLogLikelihoodsByPartition = env->GetDoubleArrayElements(outSumLogLikelihoodByPartition, NULL);
    jdouble *sumLogLikelihoods = env->GetDoubleArrayElements(outSumLogLikelihoods, NULL);

    jint errCode = (jint)beagleCalculateRootLogLikelihoodsByPartition(
                                                           instance,
                                                           (int *)bufferIndices,
                                                           (int *)weightsIndices,
                                                           (int *)frequenciesIndices,
                                                           (int *)scalingIndices,
                                                           (int *)partitionIndices,
                                                           partitionCount,
                                                           count,
                                                           (double *)sumLogLikelihoodsByPartition,
                                                           (double *)sumLogLikelihoods);

    // not using JNI_ABORT flag here because we want the values to be copied back...
    env->ReleaseDoubleArrayElements(outSumLogLikelihoodByPartition, sumLogLikelihoodsByPartition, 0);
    env->ReleaseDoubleArrayElements(outSumLogLikelihoods, sumLogLikelihoods, 0);

    env->ReleaseIntArrayElements(inPartitionIndices, partitionIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inScalingIndices, scalingIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inStateFrequenciesIndices, frequenciesIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inCategoryWeightsIndices, weightsIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inBufferIndices, bufferIndices, JNI_ABORT);

    return errCode;
}